

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

void __thiscall QLineEditIconButton::startOpacityAnimation(QLineEditIconButton *this,qreal endValue)

{
  QPropertyAnimation *this_00;
  long in_FS_OFFSET;
  Object local_68 [8];
  QArrayDataPointer<char> local_60;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QPropertyAnimation *)operator_new(0x10);
  local_48._0_8_ = (PrivateShared *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr = (char *)0x0;
  local_48._8_8_ = "opacity";
  local_60.size = 0;
  local_48._16_8_ = 7;
  QPropertyAnimation::QPropertyAnimation
            (this_00,(QObject *)this,(QByteArray *)local_48,(QObject *)this);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_48);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
  local_48._0_8_ = onAnimationFinished;
  local_48._8_8_ = (char *)0x0;
  QObject::connect<void(QAbstractAnimation::*)(),void(QLineEditIconButton::*)()>
            (local_68,(offset_in_QAbstractAnimation_to_subr)this_00,
             (ContextType *)QAbstractAnimation::finished,
             (offset_in_QLineEditIconButton_to_subr *)0x0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QVariantAnimation::setDuration((DeletionPolicy)this_00);
  ::QVariant::QVariant((QVariant *)local_48,endValue);
  QVariantAnimation::setEndValue((QVariant *)this_00);
  ::QVariant::~QVariant((QVariant *)local_48);
  QAbstractAnimation::start((DeletionPolicy)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditIconButton::startOpacityAnimation(qreal endValue)
{
    QPropertyAnimation *animation = new QPropertyAnimation(this, QByteArrayLiteral("opacity"), this);
    connect(animation, &QPropertyAnimation::finished, this, &QLineEditIconButton::onAnimationFinished);

    animation->setDuration(160);
    animation->setEndValue(endValue);
    animation->start(QAbstractAnimation::DeleteWhenStopped);
}